

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<kj::StringTree,kj::String&,char_const*,kj::StringTree,char_const*,kj::StringPtr&,char_const(&)[11],kj::StringPtr&,char_const(&)[56],kj::StringTree,char_const(&)[9],kj::CappedArray<char,17ul>&,char_const(&)[6],unsigned_short&,char_const(&)[14],bool&,char_const(&)[7]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,String *params_1,
          char **params_2,StringTree *params_3,char **params_4,StringPtr *params_5,
          char (*params_6) [11],StringPtr *params_7,char (*params_8) [56],StringTree *params_9,
          char (*params_10) [9],CappedArray<char,_17UL> *params_11,char (*params_12) [6],
          unsigned_short *params_13,char (*params_14) [14],bool *params_15,char (*params_16) [7])

{
  Branch *pBVar1;
  ArrayPtr<const_char> local_110;
  ArrayPtr<const_char> local_100;
  ArrayPtr<const_char> local_f0;
  ArrayPtr<const_char> local_e0;
  ArrayPtr<const_char> local_d0;
  ArrayPtr<const_char> local_c0;
  ArrayPtr<const_char> local_b0;
  undefined1 local_a0 [16];
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_8UL> local_70;
  CappedArray<char,_8UL> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  pBVar1 = (Branch *)(params->text).content.ptr;
  local_a0._0_8_ = pBVar1;
  if (pBVar1 != (Branch *)0x0) {
    local_a0._0_8_ = params->size_;
  }
  local_a0._8_8_ = (char *)0x0;
  if (pBVar1 != (Branch *)0x0) {
    local_a0._8_8_ = (char *)((long)&pBVar1[-1].content.branches.disposer + 7);
  }
  local_b0 = toCharSequence<char_const*>((char **)params_1);
  local_c0 = toCharSequence<char_const*>((char **)params_3);
  local_d0.ptr = *params_4;
  local_d0.size_ = (size_t)(params_4[1] + -1);
  local_e0 = toCharSequence<char_const(&)[11]>((char (*) [11])params_5);
  local_f0.ptr = *(char **)*params_6;
  local_f0.size_ = *(long *)(*params_6 + 8) - 1;
  local_100 = toCharSequence<char_const(&)[56]>((char (*) [56])params_7);
  local_110 = toCharSequence<char_const(&)[9]>((char (*) [9])params_9);
  local_40.size_ = *(size_t *)*params_10;
  local_40.ptr = *params_10 + 8;
  local_50 = toCharSequence<char_const(&)[6]>((char (*) [6])params_11);
  local_60 = toCharSequence<unsigned_short&>((unsigned_short *)params_12);
  local_70 = (CappedArray<char,_8UL>)toCharSequence<char_const(&)[14]>((char (*) [14])params_13);
  local_80 = (ArrayPtr<const_char>)toCharSequence<bool&>((bool *)params_14);
  local_90 = toCharSequence<char_const(&)[7]>((char (*) [7])params_15);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)this,(StringTree *)local_a0,&local_b0,
             (ArrayPtr<const_char> *)params_2,(StringTree *)&local_c0,&local_d0,&local_e0,&local_f0,
             &local_100,(ArrayPtr<const_char> *)params_8,(StringTree *)&local_110,&local_40,
             &local_50,(ArrayPtr<const_char> *)&local_60,&local_70,&local_80,(StringPtr *)&local_90,
             (ArrayPtr<const_char> *)this);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}